

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O0

ostream * Hpipe::cc(ostream *os,int r)

{
  ostream *poVar1;
  int r_local;
  ostream *os_local;
  
  if (r == 0x5c) {
    os_local = std::operator<<(os,"\'\\\\\'");
  }
  else if (((r < 0x20) || (0x7e < r)) || (r == 0x27)) {
    os_local = (ostream *)std::ostream::operator<<(os,r);
  }
  else {
    poVar1 = std::operator<<(os,"\'");
    poVar1 = std::operator<<(poVar1,(char)r);
    os_local = std::operator<<(poVar1,"\'");
  }
  return os_local;
}

Assistant:

static std::ostream &cc( std::ostream &os, int r ) {
    if ( r == '\\' )
        return os << "'\\\\'";
    if ( r >= 0x20 and r <= 0x7e and r != 39 )
        return os << "'" << char( r ) << "'";
    return os << r;
}